

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2_throttle_all_channels(ConnectionLayer *cl,_Bool throttled)

{
  long *plVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int index;
  
  *(_Bool *)&cl[-8].vt = throttled;
  plVar1 = (long *)index234((tree234 *)cl[-8].logctx,0);
  if (plVar1 != (long *)0x0) {
    index = 1;
    uVar3 = extraout_RDX;
    do {
      if (plVar1[0x14] == 0) {
        if (((*(char *)((long)plVar1 + 0x1e) == '\0') && (*(char *)(*plVar1 + 0x60) == '\0')) &&
           (*(char *)((long)plVar1 + 0x1c) == '\0')) {
          uVar2 = CONCAT71((int7)((ulong)*plVar1 >> 8),(*(byte *)(plVar1 + 3) & 1) == 0);
        }
        else {
          uVar2 = 0;
        }
        (**(code **)(*(long *)plVar1[0x15] + 0x28))((long *)plVar1[0x15],uVar2 & 0xff,uVar3,uVar2);
      }
      plVar1 = (long *)index234((tree234 *)cl[-8].logctx,index);
      index = index + 1;
      uVar3 = extraout_RDX_00;
    } while (plVar1 != (long *)0x0);
  }
  return;
}

Assistant:

static void ssh2_throttle_all_channels(ConnectionLayer *cl, bool throttled)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c;
    int i;

    s->all_channels_throttled = throttled;

    for (i = 0; NULL != (c = index234(s->channels, i)); i++)
        if (!c->sharectx)
            ssh2_channel_check_throttle(c);
}